

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

int __thiscall
leveldb::anon_unknown_0::ReverseKeyComparator::Compare(ReverseKeyComparator *this,Slice *a,Slice *b)

{
  int iVar1;
  Comparator *pCVar2;
  Slice local_90 [2];
  Slice local_70 [2];
  Slice local_50 [2];
  Slice local_30;
  Slice *local_20;
  Slice *b_local;
  Slice *a_local;
  ReverseKeyComparator *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (Slice *)this;
  pCVar2 = BytewiseComparator();
  Reverse_abi_cxx11_(local_50);
  Slice::Slice(&local_30,(string *)local_50);
  Reverse_abi_cxx11_(local_90);
  Slice::Slice(local_70,(string *)local_90);
  iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_30,local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_50);
  return iVar1;
}

Assistant:

int Compare(const Slice& a, const Slice& b) const override {
    return BytewiseComparator()->Compare(Reverse(a), Reverse(b));
  }